

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O0

int raplcap_msr_pd_set_zone_clamped
              (raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,int clamped)

{
  int iVar1;
  raplcap_msr *ctx;
  off_t msr_00;
  off_t msr;
  raplcap_msr *state;
  uint64_t msrval;
  int clamped_local;
  raplcap_zone zone_local;
  uint32_t die_local;
  uint32_t pkg_local;
  raplcap *rc_local;
  
  msrval._0_4_ = clamped;
  msrval._4_4_ = zone;
  clamped_local = die;
  zone_local = pkg;
  _die_local = rc;
  ctx = get_state(rc,pkg,die);
  msr_00 = zone_to_msr_offset(msrval._4_4_,ZONE_OFFSETS_PL);
  if (((ctx != (raplcap_msr *)0x0) && (-1 < msr_00)) &&
     (iVar1 = msr_sys_read(ctx->sys,(uint64_t *)&state,zone_local,clamped_local,msr_00), iVar1 == 0)
     ) {
    state = (raplcap_msr *)
            msr_set_zone_clamped
                      (&ctx->ctx,msrval._4_4_,(uint64_t)state,(int *)&msrval,(int *)&msrval);
    iVar1 = msr_sys_write(ctx->sys,(uint64_t)state,zone_local,clamped_local,msr_00);
    return iVar1;
  }
  return -1;
}

Assistant:

int raplcap_msr_pd_set_zone_clamped(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone, int clamped) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  raplcap_log(DEBUG, "raplcap_msr_pd_set_zone_clamped: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
    return -1;
  }
  msrval = msr_set_zone_clamped(&state->ctx, zone, msrval, &clamped, &clamped);
  return msr_sys_write(state->sys, msrval, pkg, die, msr);
}